

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::_::
ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
::disposeImpl(ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
              *this,void *param_1,size_t param_2,size_t param_3,size_t param_4,
             _func_void_void_ptr *param_5)

{
  OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
  ::~OwnedBundle(&this->
                  super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
                );
  operator_delete(this,0x40);
  return;
}

Assistant:

void disposeImpl(void*, size_t, size_t, size_t, void (*)(void*)) const override { delete this; }